

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool ReplaceDefineInternal(char *lp,char *nl)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool local_9e;
  bool didParseBrackets;
  char *expLp;
  CStringsList *pCStack_88;
  aint val;
  CStringsList *a;
  char *pcStack_78;
  bool canSubstituteInside;
  char *wholeIdLp;
  char *nextSubIdLp;
  char *kp;
  char local_58 [6];
  char c2;
  char c1;
  char defarrayCountTxt [16];
  bool afterNonAlphaNumNext;
  bool afterNonAlphaNum;
  char *pcStack_38;
  bool isDefDir;
  char *ver;
  char *nid;
  char *rp;
  int dr;
  int definegereplaced;
  char *nl_local;
  char *lp_local;
  
  rp._4_4_ = 0;
  bVar8 = false;
  nid = nl;
  _dr = nl;
  nl_local = lp;
  memset(local_58,0,0x10);
  bVar7 = true;
LAB_0013340a:
  do {
    if (*nl_local == '\0' || 0x7ff < (long)nid - (long)_dr) {
LAB_00133c20:
      *nid = '\0';
      if (0x7ff < (long)(nid + 1) - (long)_dr) {
        nid = nid + 1;
        Error("line too long after macro expansion",_dr,SUPPRESS);
      }
      nid = _dr;
      iVar2 = SkipBlanks(&nid);
      if (iVar2 != 0) {
        *_dr = '\0';
      }
      substitutedLine = _dr;
      return rp._4_4_ != 0;
    }
    kp._7_1_ = *nl_local;
    kp._6_1_ = nl_local[1];
    iVar2 = isalnum((uint)kp._7_1_);
    bVar6 = iVar2 == 0;
    if ((kp._7_1_ != 0x2f) || (kp._6_1_ != '*')) {
      if (comlin == 0) {
        if ((kp._7_1_ == 0x3b) || ((kp._7_1_ == 0x2f && (kp._6_1_ == '/')))) {
          if ((eolComment == (char *)0x0) && (((char *)0x1e1baf < nl_local && (nl_local < temp)))) {
            eolComment = nl_local;
          }
          goto LAB_00133c20;
        }
        if ((bVar7) && ((kp._7_1_ == 0x22 || (kp._7_1_ == 0x27)))) {
          *nid = *nl_local;
          pcVar3 = nid;
          pcVar4 = nl_local;
          while( true ) {
            nl_local = pcVar4 + 1;
            nid = pcVar3 + 1;
            bVar7 = false;
            if (*nl_local != '\0') {
              bVar7 = kp._7_1_ != *nl_local;
            }
            if (!bVar7) break;
            if (((kp._7_1_ == 0x22) && (*nl_local == '\\')) && (pcVar4[2] != '\0')) {
              *nid = *nl_local;
              nid = pcVar3 + 2;
              nl_local = pcVar4 + 2;
            }
            *nid = *nl_local;
            pcVar3 = nid;
            pcVar4 = nl_local;
          }
          bVar7 = bVar6;
          if (*nl_local != '\0') {
            *nid = *nl_local;
            nid = pcVar3 + 2;
            nl_local = pcVar4 + 2;
          }
        }
        else {
          bVar1 = isLabelStart(nl_local,false);
          if (bVar1) {
            nextSubIdLp = nl_local;
            bVar1 = false;
            if (bVar7) {
              iVar2 = cmphstr(&nextSubIdLp,"define+",false);
              bVar1 = true;
              if (iVar2 == 0) {
                iVar2 = cmphstr(&nextSubIdLp,"define",false);
                bVar1 = true;
                if (iVar2 == 0) {
                  iVar2 = cmphstr(&nextSubIdLp,"undefine",false);
                  bVar1 = true;
                  if (iVar2 == 0) {
                    iVar2 = cmphstr(&nextSubIdLp,"defarray+",false);
                    bVar1 = true;
                    if (iVar2 == 0) {
                      iVar2 = cmphstr(&nextSubIdLp,"defarray",false);
                      bVar1 = true;
                      if (iVar2 == 0) {
                        iVar2 = cmphstr(&nextSubIdLp,"ifdef",false);
                        bVar1 = true;
                        if (iVar2 == 0) {
                          iVar2 = cmphstr(&nextSubIdLp,"ifndef",false);
                          bVar1 = iVar2 != 0;
                        }
                      }
                    }
                  }
                }
              }
            }
            bVar8 = bVar8 || bVar1;
            ResetGrowSubId();
            wholeIdLp = nl_local;
            pcStack_78 = nl_local;
            do {
              pcVar3 = GrowSubId(&nl_local);
              local_9e = *pcVar3 != '_' || wholeIdLp == pcStack_78;
              a._7_1_ = local_9e;
              if (((macrolabp == (char *)0x0) || (*pcVar3 == '_' && wholeIdLp != pcStack_78)) ||
                 (pcStack_38 = CMacroDefineTable::getverv(&MacroDefineTable,pcVar3),
                 pcStack_38 == (char *)0x0)) {
                if (((bVar8) || ((a._7_1_ & 1) == 0)) ||
                   (pcStack_38 = CDefineTable::Get(&DefineTable,pcVar3), pcStack_38 == (char *)0x0))
                {
                  rp._0_4_ = 0;
                  pcStack_38 = pcVar3;
                }
                else {
                  rp._0_4_ = 1;
                  if (DefineTable.DefArrayList != (CStringsList *)0x0) {
                    pCStack_88 = DefineTable.DefArrayList;
                    while (bVar7 = White(*nl_local), bVar7) {
                      GrowSubIdByExtraChar(&nl_local);
                    }
                    if (*nl_local != '[') {
                      Error("[ARRAY] Expression error",wholeIdLp,SUPPRESS);
                    }
                    if (((*nl_local == '[') && (nl_local[1] == '#')) && (nl_local[2] == ']')) {
                      nl_local = nl_local + 3;
                      expLp._4_4_ = 0;
                      for (; pCStack_88 != (CStringsList *)0x0; pCStack_88 = pCStack_88->next) {
                        expLp._4_4_ = expLp._4_4_ + 1;
                      }
                      snprintf(local_58,0x10,"%d",(ulong)expLp._4_4_);
                      pcStack_38 = local_58;
                    }
                    else {
                      pcVar4 = nl_local + (int)(uint)(*nl_local == '[');
                      IsLabelNotFound = false;
                      bVar7 = false;
                      if (*nl_local == '[') {
                        pcVar5 = GrowSubIdByExtraChar(&nl_local);
                        bVar7 = false;
                        if (pcVar5 != (char *)0x0) {
                          iVar2 = ParseExpressionInSubstitution
                                            (&nl_local,(aint *)((long)&expLp + 4));
                          bVar7 = false;
                          if (iVar2 != 0) {
                            bVar7 = *nl_local == ']';
                          }
                        }
                      }
                      if ((bVar7) && ((IsLabelNotFound & 1U) == 0)) {
                        nl_local = nl_local + 1;
                        for (; 0 < (int)expLp._4_4_ && pCStack_88 != (CStringsList *)0x0;
                            expLp._4_4_ = expLp._4_4_ - 1) {
                          pCStack_88 = pCStack_88->next;
                        }
                        if (((int)expLp._4_4_ < 0) || (pCStack_88 == (CStringsList *)0x0)) {
                          local_58[0] = '\0';
                          pcStack_38 = local_58;
                          Error("[ARRAY] index not in 0..<Size-1> range",wholeIdLp,SUPPRESS);
                        }
                        else {
                          pcStack_38 = pCStack_88->string;
                        }
                      }
                      else {
                        rp._0_4_ = -1;
                        pcStack_38 = pcVar3;
                        nl_local = pcVar4;
                      }
                    }
                  }
                }
              }
              else {
                rp._0_4_ = 2;
              }
              if (((int)rp == 0) && (iVar2 = islabchar(*nl_local), iVar2 == 0)) {
                nl_local = wholeIdLp;
                ResetGrowSubId();
                pcStack_38 = GrowSubId(&nl_local);
                rp._0_4_ = -1;
              }
              if (0 < (int)rp) {
                rp._4_4_ = 1;
              }
              if ((int)rp != 0) {
                while (*pcStack_38 != '\0' && (long)nid - (long)_dr < 0x800) {
                  *nid = *pcStack_38;
                  pcStack_38 = pcStack_38 + 1;
                  nid = nid + 1;
                }
                ResetGrowSubId();
                wholeIdLp = nl_local;
              }
              iVar2 = islabchar(*nl_local);
              bVar7 = bVar6;
            } while (iVar2 != 0);
          }
          else {
            *nid = *nl_local;
            nid = nid + 1;
            nl_local = nl_local + 1;
            bVar7 = bVar6;
          }
        }
      }
      else if ((kp._7_1_ == 0x2a) && (kp._6_1_ == '/')) {
        nl_local = nl_local + 2;
        if (comlin == 1) {
          *nid = ' ';
          nid = nid + 1;
        }
        comlin = comlin + -1;
        bVar7 = bVar6;
      }
      else {
        nl_local = nl_local + 1;
        bVar7 = bVar6;
      }
      goto LAB_0013340a;
    }
    comlin = comlin + 1;
    nl_local = nl_local + 2;
    bVar7 = bVar6;
  } while( true );
}

Assistant:

static bool ReplaceDefineInternal(char* lp, char* const nl) {
	int definegereplaced = 0,dr;
	char* rp = nl,* nid;
	const char* ver;
	bool isDefDir = false;	// to remember if one of DEFINE-related directives was used
	bool afterNonAlphaNum, afterNonAlphaNumNext = true;
	char defarrayCountTxt[16] = { 0 };
	while (*lp && ((rp - nl) < LINEMAX)) {
		const char c1 = lp[0], c2 = lp[1];
		afterNonAlphaNum = afterNonAlphaNumNext;
		afterNonAlphaNumNext = !isalnum((byte)c1);
		if (c1 == '/' && c2 == '*') {	// block-comment local beginning (++block_nesting)
			lp += 2;
			++comlin;
			continue;
		}
		if (comlin) {
			if (c1 == '*' && c2 == '/') {
				lp += 2;
				// insert space into line, if the block ending may have affected parsing of line
				if (1 == comlin) {
					*rp++ = ' ';		// ^^ otherwise this line is completely commented out
				}
				--comlin;	// decrement block comment counter
			} else {
				++lp;		// just skip all characters inside comment block
			}
			continue;
		}
		// for following code (0 == comlin) (unless it has its own parse loop)

		// single line comments -> finish
		if (c1 == ';' || (c1 == '/' && c2 == '/')) {
			// set empty eol line comment, if the source of data is still the original "line" buffer
			if (!eolComment && line <= lp && lp < line+LINEMAX) eolComment = lp;
			break;
		}

		// strings parsing
		if (afterNonAlphaNum && (c1 == '"' || c1 == '\'')) {
			*rp++ = *lp++;				// copy the string delimiter (" or ')
			// apostrophe inside apostrophes ('') will parse as end + start of another string
			// which sort of "accidentally" leads to correct final results
			while (*lp && c1 != *lp) {	// until end of current string is reached (or line ends)
				// inside double quotes the backslash should escape (anything after it)
				if ('"' == c1 && '\\' == *lp && lp[1]) *rp++ = *lp++;	// copy escaping backslash extra
				*rp++ = *lp++;			// copy string character
			}
			if (*lp) *rp++ = *lp++;		// copy the ending string delimiter (" or ')
			continue;
		}

		if (!isLabelStart(lp, false)) {
			*rp++ = *lp++;
			continue;
		}

		// update "is define-related directive" for remainder of the line
		char* kp = lp;
		isDefDir |= afterNonAlphaNum && (cmphstr(kp, "define+") || cmphstr(kp, "define")
			|| cmphstr(kp, "undefine") || cmphstr(kp, "defarray+") || cmphstr(kp, "defarray")
			|| cmphstr(kp, "ifdef") || cmphstr(kp, "ifndef"));
		// if DEFINE-related directive was used, only macro-arguments are substituted
		// in the remaining part of the line, the define-based substitution is inhibited till EOL

		// The following loop is recursive-like macro/define substitution, the `*lp` here points
		// at alphabet/underscore char, marking start of "id" string, and it will be parsed by
		// sub-id parts, delimited by underscores, each combination of consecutive sub-ids may
		// be substituted by some macro argument or define.

		//TODO - maybe consider the substitution search to go downward, from longest term to shortest subterm
		ResetGrowSubId();
		char* nextSubIdLp = lp, * wholeIdLp = lp;
		do { //while(islabchar(*lp));
			nid = GrowSubId(lp);		// grow the current sub-id part by part, checking each combination for substitution
			// defines/macro arguments can substitute in the middle of ID only if they don't start with underscore
			const bool canSubstituteInside = '_' != nid[0] || nextSubIdLp == wholeIdLp;
			if (macrolabp && canSubstituteInside && (ver = MacroDefineTable.getverv(nid))) {
				dr = 2;			// macro argument substitution is possible
			} else if (!isDefDir && canSubstituteInside && (ver = DefineTable.Get(nid))) {
				dr = 1;			// DEFINE substitution is possible
				//handle DEFARRAY case
				if (DefineTable.DefArrayList) {
					ver = nid;	// in case of some error, just copy the array id "as is"
					CStringsList* a = DefineTable.DefArrayList;
					while (White(*lp)) GrowSubIdByExtraChar(lp);
					aint val;
					if ('[' != *lp) Error("[ARRAY] Expression error", nextSubIdLp, SUPPRESS);
					if ('[' == *lp && '#' == lp[1] && ']' == lp[2]) {	// calculate size of defarray
						lp += 3;
						val = 0;
						while (a) {
							++val;
							a = a->next;
						}
						SPRINTF1(defarrayCountTxt, 16, "%d", val);
						ver = defarrayCountTxt;
					} else {
						char* expLp = lp + ('[' == *lp);	// the '[' will become part of subId in didParseBrackets
						IsLabelNotFound = false;
						bool didParseBrackets = '[' == *lp && GrowSubIdByExtraChar(lp) && ParseExpressionInSubstitution(lp, val) && ']' == *lp;
						if (didParseBrackets && !IsLabelNotFound) {
							// expression was successfully parsed and all values were known
							++lp;
							while (0 < val && a) {
								a = a->next;
								--val;
							}
							if (val < 0 || NULL == a) {
								*defarrayCountTxt = 0;		// substitute with empty string
								ver = defarrayCountTxt;
								Error("[ARRAY] index not in 0..<Size-1> range", nextSubIdLp, SUPPRESS);
							} else {
								ver = a->string;	// substitute with array value
							}
						} else {	// no substition of array possible at this time (index eval / syntax error)
							lp = expLp;				// restore lp in case expression parser went ahead a lot
							dr = -1;// write into output, but don't count as replacement
						}
					}
				}
			} else {
				dr = 0;			// no possible substitution found
				ver = nid;
			}
			// check if no substition was found, and there's no more chars to extend SubId
			if (0 == dr && !islabchar(*lp)) {
				lp = nextSubIdLp;		// was fully extended, no match, "eat" first subId
				ResetGrowSubId();
				ver = GrowSubId(lp);	// find the first SubId again, for the copy
				dr = -1;				// write into output, but don't count as replacement
			}
			if (0 < dr) definegereplaced = 1;		// above zero => count as replacement
			if (0 != dr) {				// any non-zero dr => write to the output
				while (*ver && ((rp - nl) < LINEMAX)) *rp++ = *ver++;		// replace the string into target buffer
				// reset subId parser to catch second+ subId in current Id
				ResetGrowSubId();
				nextSubIdLp = lp;
			}
			// continue with extending the subId, if there's still something to parse
		} while(islabchar(*lp));
	} // while(*lp)
	// add line terminator to the output buffer
	*rp++ = 0;
	if (LINEMAX <= (rp - nl)) {
		Error("line too long after macro expansion", nl, SUPPRESS);
	}
	// check if whole line is just blanks, then return just empty one
	rp = nl;
	if (SkipBlanks(rp)) *nl = 0;
	substitutedLine = nl;		// set global pointer to the latest substituted version
	return definegereplaced;
}